

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFile.cpp
# Opt level: O0

bool __thiscall DirectiveObjImport::Validate(DirectiveObjImport *this,ValidateState *state)

{
  bool bVar1;
  uint uVar2;
  pointer pCVar3;
  byte local_31;
  size_t local_28;
  int64_t memory;
  ValidateState *pVStack_18;
  bool result;
  ValidateState *state_local;
  DirectiveObjImport *this_local;
  
  memory._7_1_ = 0;
  pVStack_18 = state;
  state_local = (ValidateState *)this;
  bVar1 = std::operator!=(&this->ctor,(nullptr_t)0x0);
  if (bVar1) {
    pCVar3 = std::unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>::operator->
                       (&this->ctor);
    uVar2 = (*pCVar3->_vptr_CAssemblerCommand[2])(pCVar3,pVStack_18);
    if ((uVar2 & 1) != 0) {
      memory._7_1_ = 1;
    }
  }
  local_28 = FileManager::getVirtualAddress(g_fileManager);
  ElfRelocator::relocate(&this->rel,(int64_t *)&local_28);
  FileManager::advanceMemory(g_fileManager,local_28);
  bVar1 = ElfRelocator::hasDataChanged(&this->rel);
  local_31 = 1;
  if (!bVar1) {
    local_31 = memory._7_1_;
  }
  return (bool)(local_31 & 1);
}

Assistant:

bool DirectiveObjImport::Validate(const ValidateState &state)
{
	bool result = false;
	if (ctor != nullptr && ctor->Validate(state))
		result = true;

	int64_t memory = g_fileManager->getVirtualAddress();
	rel.relocate(memory);
	g_fileManager->advanceMemory((size_t)memory);

	return rel.hasDataChanged() || result;
}